

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestApp.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  long lVar3;
  NetworkConfig config;
  Server WebServer;
  int local_1394;
  Server local_1390;
  
  local_1394 = 1;
  http::Server::Server(&local_1390);
  iVar2 = 0;
  printf("%d bit build\n",0x40);
  bVar1 = 1 < argc;
  if (1 < argc) {
    lVar3 = 1;
    do {
      __s1 = argv[lVar3];
      iVar2 = strcmp(__s1,"-devices");
      if (iVar2 == 0) {
        PacketIO::DisplayDevices();
        iVar2 = 0;
        goto LAB_00104331;
      }
      iVar2 = strcmp(__s1,"-use");
      if (iVar2 != 0) {
        printf("unknown option \'%s\'\n",__s1);
        iVar2 = -1;
        goto LAB_00104331;
      }
      local_1394 = atoi(argv[lVar3 + 1]);
      lVar3 = lVar3 + 2;
      bVar1 = (int)lVar3 < argc;
    } while ((int)lVar3 < argc);
    iVar2 = 0;
  }
LAB_00104331:
  if (bVar1) {
    osThread::~osThread(&local_1390.Thread);
    lVar3 = 0xbc0;
    do {
      http::Page::~Page((Page *)(&local_1390.field_0x0 + lVar3));
      lVar3 = lVar3 + -0x5e0;
    } while (lVar3 != -0x5e0);
    return iVar2;
  }
  http::Server::RegisterPageHandler(&local_1390,ProcessPageRequest);
  osThread::Create(&NetworkThread,NetworkEntry,"Network",0x400,10,&local_1394);
  usleep(1000000);
  osEvent::Wait(&StartEvent,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test_app/TestApp.cpp"
                ,0x16c,-1);
  http::Server::Initialize(&local_1390,(InterfaceMAC *)&tcpStack,&tcpStack.TCP,0x50);
  DefaultStack::StartDHCP(&tcpStack);
  do {
    usleep(100000);
    DefaultStack::Tick(&tcpStack);
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
    NetworkConfig config;
    config.interfaceNumber = 1;
    http::Server WebServer;

    printf("%d bit build\n", (sizeof(void*) == 4 ? 32 : 64));

    // Start at 1 to skip the file name
    for (int i = 1; i < argc; i++)
    {
        if (!strcmp(argv[i], "-devices"))
        {
            PacketIO::DisplayDevices();
            return 0;
        }
        else if (!strcmp(argv[i], "-use"))
        {
            config.interfaceNumber = atoi(argv[++i]);
        }
        else
        {
            printf("unknown option '%s'\n", argv[i]);
            return -1;
        }
    }

    WebServer.RegisterPageHandler(ProcessPageRequest);
    NetworkThread.Create(NetworkEntry, "Network", 1024, 10, &config);

#ifdef _WIN32
    Sleep(1000);
#elif __linux__
    usleep(1000000);
#endif
    StartEvent.Wait(__FILE__, __LINE__);

    WebServer.Initialize(tcpStack.MAC, tcpStack.TCP, 80);

    tcpStack.StartDHCP();

    while (1)
    {
#ifdef _WIN32
        Sleep(100);
#elif __linux__
        usleep(100000);
#endif
        tcpStack.Tick();
    }
}